

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buttons.cpp
# Opt level: O2

void __thiscall GPIO::RotaryDial::decode_dial(RotaryDial *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  __int_type_conflict1 _Var4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  
  bVar1 = (this->m_pin_b).m_state;
  uVar3 = (uint)(byte)(bVar1 * '\x02' | (this->m_pin_a).m_state ^ bVar1);
  uVar8 = uVar3 - this->m_lastseq & 3;
  this->m_lastseq = uVar3;
  lVar5 = std::chrono::_V2::steady_clock::now();
  iVar2 = this->m_divider;
  if (((1 < (long)iVar2) && (this->m_encvalue != 0)) &&
     (500000000 < lVar5 - (this->m_last_triggered).__d.__r)) {
    this->m_encvalue = 0;
  }
  (this->m_last_triggered).__d.__r = lVar5;
  uVar6 = (ulong)uVar8;
  switch(uVar8) {
  default:
    return;
  case 1:
    break;
  case 3:
    uVar6 = 0xffffffffffffffff;
  }
  lVar7 = uVar6 + this->m_encvalue;
  this->m_encvalue = lVar7;
  lVar9 = -lVar7;
  if (0 < lVar7) {
    lVar9 = lVar7;
  }
  if (lVar9 < iVar2) {
    return;
  }
  lVar9 = lVar5 - (this->m_last_dialed).__d.__r;
  if (lVar9 < 0x3b9aca01) {
    _Var4 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(1000000000)) / SEXT816(lVar9),0);
  }
  else {
    _Var4 = 1;
  }
  LOCK();
  (this->m_speed).super___atomic_base<unsigned_int>._M_i = _Var4;
  UNLOCK();
  this->m_encvalue = 0;
  if (lVar7 < 1) {
    if ((this->m_use_range != false) &&
       ((this->m_value).super___atomic_base<long>._M_i == this->m_min)) {
      return;
    }
    LOCK();
    (this->m_value).super___atomic_base<long>._M_i =
         (this->m_value).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    lVar9 = 0x88;
    if ((this->f_down).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_0010de96;
  }
  else {
    if ((this->m_use_range != false) &&
       ((this->m_value).super___atomic_base<long>._M_i == this->m_max)) {
      return;
    }
    LOCK();
    (this->m_value).super___atomic_base<long>._M_i =
         (this->m_value).super___atomic_base<long>._M_i + 1;
    UNLOCK();
    if ((this->f_up).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_0010de96;
    lVar9 = 0x68;
  }
  std::function<void_()>::operator()
            ((function<void_()> *)
             ((long)&(this->super_InputDetect).super_ObjectBase._vptr_ObjectBase + lVar9));
LAB_0010de96:
  if ((this->f_dialed).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(bool,_long)>::operator()
              (&this->f_dialed,uVar8 == 1,(this->m_value).super___atomic_base<long>._M_i);
  }
  (this->m_last_dialed).__d.__r = lVar5;
  return;
}

Assistant:

void RotaryDial::decode_dial()
{
    // Get the current state, use a ^ b | b << 1 to generate a 2 bit sequence by turning the dial.
    // For the logic behind the next two lines see:
    // http://guy.carpenter.id.au/gaugette/2013/01/14/rotary-encoder-library-for-the-raspberry-pi/
    
    unsigned int seq   = (m_pin_a.get_state() ^ m_pin_b.get_state()) | m_pin_b.get_state() << 1;
    unsigned int delta = (seq - m_lastseq) & 0b11;
    
    //    delta	meaning
    //    0	no change
    //    1	1 step clockwise
    //    2	2 steps clockwise or counter-clockwise
    //    3	1 step counter clockwise
    
    // store value for next turn
    m_lastseq = seq;
    
    auto now = std::chrono::steady_clock::now();
    if (m_divider > 1 && m_encvalue && now - m_last_triggered > std::chrono::nanoseconds(500 * 1000 * 1000)) {
        // reset m_encvalue, it has run out of sync by some bounces, and
        // needs certainly less than half a second between two events in a grey sequence
        m_encvalue = 0;
    }
    m_last_triggered = now;
    
    switch (delta) {
        case 0:
            // no turn
            return;
        case 1:
            ++m_encvalue;
            break;
        case 2:
            // we could assume a fast turn to the last direction, but we simply
            // drop this result (actually, the interrupt driven approach on the
            // Raspberry is fast enough to never run into this case)
            return;
        case 3:
            --m_encvalue;
            break;
    }

    if (std::abs(m_encvalue) >= m_divider) {

        set_speed(now - m_last_dialed);
        
        if (m_encvalue > 0) {
            m_encvalue = 0;
            if (m_use_range && m_value == m_max) return;
            ++m_value;
            // call the function pointer
            if (f_up) f_up();
        } else {
            m_encvalue = 0;
            if (m_use_range && m_value == m_min) return;
            --m_value;
            // call the function pointer
            if (f_down) f_down();
        }
        
        // call the function pointer
        if (f_dialed) f_dialed(delta == 1, m_value);

        m_last_dialed = now;
    }
    
}